

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di.hpp
# Opt level: O1

shared<boost::ext::di::v1_3_0::scopes::singleton,_controller,_std::shared_ptr<controller>_&>
__thiscall
boost::ext::di::v1_3_0::scopes::singleton::
scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>
          (scope_impl<controller,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *this,
          provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
          *provider)

{
  int iVar1;
  heap local_9;
  
  if (create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
      ::object == '\0') {
    iVar1 = __cxa_guard_acquire(&create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                                 ::object);
    if (iVar1 != 0) {
      scope_impl<controller,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
      create_impl<controller,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
      ::object.super___shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           core::successful::
           provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>
           ::get<boost::ext::di::v1_3_0::type_traits::heap>(provider,&local_9);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<controller*>
                (&scope_impl<controller,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                  ::
                  create_impl<controller,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                  ::object.super___shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 scope_impl<controller,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                 ::
                 create_impl<controller,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                 ::object.super___shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      __cxa_atexit(std::__shared_ptr<controller,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &scope_impl<controller,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>
                    ::
                    create_impl<controller,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
                    ::object,&__dso_handle);
      __cxa_guard_release(&create_impl<controller,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>>(boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>>>const&)
                           ::object);
    }
  }
  return (shared<boost::ext::di::v1_3_0::scopes::singleton,_controller,_std::shared_ptr<controller>_&>
          )&scope_impl<controller,_boost::ext::di::v1_3_0::aux::integral_constant<bool,_true>_>::
            create_impl<controller,_boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<controller,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::direct,_boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>,_boost::ext::di::v1_3_0::core::any_type_ref_fwd<controller>_>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>_>_>_>
            ::object;
}

Assistant:

auto create_impl(const TProvider& provider) {
      static std::shared_ptr<T_> object{provider.get()};
      return wrappers::shared<singleton, T_, std::shared_ptr<T_>&>{object};
    }